

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFSCharter.cpp
# Opt level: O2

void __thiscall FSCConnection::FSCConnection(FSCConnection *this)

{
  reference pvVar1;
  char url [128];
  
  LTFlightDataChannel::LTFlightDataChannel
            (&this->super_LTFlightDataChannel,DR_CHANNEL_FSCHARTER,"FSCharter",CHT_TRACKING_DATA);
  (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel =
       (_func_int **)&PTR__FSCConnection_002bbf30;
  (this->base_url)._M_dataplus._M_p = (pointer)&(this->base_url).field_2;
  (this->base_url)._M_string_length = 0;
  (this->base_url).field_2._M_local_buf[0] = '\0';
  this->fscStatus = FSC_STATUS_NONE;
  this->pCurlHeader = (curl_slist *)0x0;
  (this->token)._M_dataplus._M_p = (pointer)&(this->token).field_2;
  (this->token)._M_string_length = 0;
  (this->token).field_2._M_local_buf[0] = '\0';
  (this->token_type)._M_dataplus._M_p = (pointer)&(this->token_type).field_2;
  (this->token_type)._M_string_length = 0;
  (this->token_type).field_2._M_local_buf[0] = '\0';
  (this->error_status)._M_dataplus._M_p = (pointer)&(this->error_status).field_2;
  (this->error_status)._M_string_length = 0;
  (this->error_status).field_2._M_local_buf[0] = '\0';
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  this->error_code = 0;
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlName);
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlLink);
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlPopup);
  url[0x70] = '\0';
  url[0x71] = '\0';
  url[0x72] = '\0';
  url[0x73] = '\0';
  url[0x74] = '\0';
  url[0x75] = '\0';
  url[0x76] = '\0';
  url[0x77] = '\0';
  url[0x78] = '\0';
  url[0x79] = '\0';
  url[0x7a] = '\0';
  url[0x7b] = '\0';
  url[0x7c] = '\0';
  url[0x7d] = '\0';
  url[0x7e] = '\0';
  url[0x7f] = '\0';
  url[0x60] = '\0';
  url[0x61] = '\0';
  url[0x62] = '\0';
  url[99] = '\0';
  url[100] = '\0';
  url[0x65] = '\0';
  url[0x66] = '\0';
  url[0x67] = '\0';
  url[0x68] = '\0';
  url[0x69] = '\0';
  url[0x6a] = '\0';
  url[0x6b] = '\0';
  url[0x6c] = '\0';
  url[0x6d] = '\0';
  url[0x6e] = '\0';
  url[0x6f] = '\0';
  url[0x50] = '\0';
  url[0x51] = '\0';
  url[0x52] = '\0';
  url[0x53] = '\0';
  url[0x54] = '\0';
  url[0x55] = '\0';
  url[0x56] = '\0';
  url[0x57] = '\0';
  url[0x58] = '\0';
  url[0x59] = '\0';
  url[0x5a] = '\0';
  url[0x5b] = '\0';
  url[0x5c] = '\0';
  url[0x5d] = '\0';
  url[0x5e] = '\0';
  url[0x5f] = '\0';
  url[0x40] = '\0';
  url[0x41] = '\0';
  url[0x42] = '\0';
  url[0x43] = '\0';
  url[0x44] = '\0';
  url[0x45] = '\0';
  url[0x46] = '\0';
  url[0x47] = '\0';
  url[0x48] = '\0';
  url[0x49] = '\0';
  url[0x4a] = '\0';
  url[0x4b] = '\0';
  url[0x4c] = '\0';
  url[0x4d] = '\0';
  url[0x4e] = '\0';
  url[0x4f] = '\0';
  url[0x30] = '\0';
  url[0x31] = '\0';
  url[0x32] = '\0';
  url[0x33] = '\0';
  url[0x34] = '\0';
  url[0x35] = '\0';
  url[0x36] = '\0';
  url[0x37] = '\0';
  url[0x38] = '\0';
  url[0x39] = '\0';
  url[0x3a] = '\0';
  url[0x3b] = '\0';
  url[0x3c] = '\0';
  url[0x3d] = '\0';
  url[0x3e] = '\0';
  url[0x3f] = '\0';
  url[0x20] = '\0';
  url[0x21] = '\0';
  url[0x22] = '\0';
  url[0x23] = '\0';
  url[0x24] = '\0';
  url[0x25] = '\0';
  url[0x26] = '\0';
  url[0x27] = '\0';
  url[0x28] = '\0';
  url[0x29] = '\0';
  url[0x2a] = '\0';
  url[0x2b] = '\0';
  url[0x2c] = '\0';
  url[0x2d] = '\0';
  url[0x2e] = '\0';
  url[0x2f] = '\0';
  url[0x10] = '\0';
  url[0x11] = '\0';
  url[0x12] = '\0';
  url[0x13] = '\0';
  url[0x14] = '\0';
  url[0x15] = '\0';
  url[0x16] = '\0';
  url[0x17] = '\0';
  url[0x18] = '\0';
  url[0x19] = '\0';
  url[0x1a] = '\0';
  url[0x1b] = '\0';
  url[0x1c] = '\0';
  url[0x1d] = '\0';
  url[0x1e] = '\0';
  url[0x1f] = '\0';
  url[0] = '\0';
  url[1] = '\0';
  url[2] = '\0';
  url[3] = '\0';
  url[4] = '\0';
  url[5] = '\0';
  url[6] = '\0';
  url[7] = '\0';
  url[8] = '\0';
  url[9] = '\0';
  url[10] = '\0';
  url[0xb] = '\0';
  url[0xc] = '\0';
  url[0xd] = '\0';
  url[0xe] = '\0';
  url[0xf] = '\0';
  pvVar1 = std::array<FSCEnvTy,_2UL>::at(&FSC_ENV,(long)dataRefs.fscEnv);
  snprintf(url,0x80,"https://%s/",(pvVar1->server)._M_dataplus._M_p);
  std::__cxx11::string::assign((char *)&this->base_url);
  return;
}

Assistant:

FSCConnection::FSCConnection () :
LTFlightDataChannel(DR_CHANNEL_FSCHARTER, FSC_NAME)
{
    // purely informational
    urlName  = FSC_CHECK_NAME;
    urlLink  = FSC_CHECK_URL;
    urlPopup = FSC_CHECK_POPUP;
    
    // base URL depends on environment in use
    char url[128] = "";
    snprintf(url, sizeof(url),
             FSC_BASE_URL,
             FSC_ENV.at(dataRefs.GetFSCEnv()).server.c_str());
    base_url = url;
}